

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void * __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::mallocAligned
          (BeagleCPUImpl<double,_1,_0> *this,size_t size)

{
  void *ptr;
  
  ptr = (void *)0x0;
  posix_memalign(&ptr,0x20,size);
  return ptr;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void* BeagleCPUImpl<BEAGLE_CPU_GENERIC>::mallocAligned(size_t size) {
    void *ptr = (void *) NULL;

#if defined (__APPLE__) || defined(WIN32)
    /*
     presumably malloc on OS X always returns
     a 16-byte aligned pointer
     */
    /* Windows malloc() always gives 16-byte alignment */
    assert(size > 0);
    ptr = malloc(size);
    if(ptr == (void*)NULL) {
        assert(0);
    }
#else
    #if (T_PAD == 1)
        const size_t align = 32;
    #else // T_PAD == 2
        const size_t align = 32; // Changed from 16 (under SSE) to ensure AVX alignment
    #endif
    int res;
    res = posix_memalign(&ptr, align, size);
    if (res != 0) {
        assert(0);
    }
#endif

    return ptr;
}